

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int reserve_ds(flatcc_builder_t *B,size_t need,flatbuffers_uoffset_t limit)

{
  int iVar1;
  
  iVar1 = (*B->alloc)(B->alloc_context,B->buffers + 1,B->ds_first + need,1,1);
  if (iVar1 == 0) {
    refresh_ds(B,limit);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int reserve_ds(flatcc_builder_t *B, size_t need, uoffset_t limit)
{
    iovec_t *buf = B->buffers + flatcc_builder_alloc_ds;

    if (B->alloc(B->alloc_context, buf, B->ds_first + need, 1, flatcc_builder_alloc_ds)) {
        return -1;
    }
    refresh_ds(B, limit);
    return 0;
}